

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

uint64_t __thiscall
duckdb::ParquetReader::GetGroupSpan(ParquetReader *this,ParquetReaderScanState *state)

{
  _ColumnMetaData__isset _Var1;
  pointer pCVar2;
  ParquetRowGroup *pPVar3;
  ulong uVar4;
  uint64_t uVar5;
  ColumnChunk *column_chunk;
  pointer pCVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  pPVar3 = GetGroup(this,state);
  pCVar6 = (pPVar3->columns).
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (pPVar3->columns).
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar6 == pCVar2) {
    uVar5 = 1;
  }
  else {
    uVar7 = 0xffffffffffffffff;
    uVar4 = 0;
    do {
      _Var1 = (pCVar6->meta_data).__isset;
      uVar8 = 0xffffffffffffffff;
      if (((byte)_Var1 & 4) != 0) {
        uVar8 = (pCVar6->meta_data).dictionary_page_offset;
      }
      if ((((byte)_Var1 & 2) != 0) &&
         (uVar9 = (pCVar6->meta_data).index_page_offset, uVar9 <= uVar8)) {
        uVar8 = uVar9;
      }
      uVar9 = (pCVar6->meta_data).data_page_offset;
      if (uVar8 < uVar9) {
        uVar9 = uVar8;
      }
      if (uVar9 < uVar7) {
        uVar7 = uVar9;
      }
      uVar9 = uVar9 + (pCVar6->meta_data).total_compressed_size;
      if (uVar4 <= uVar9) {
        uVar4 = uVar9;
      }
      pCVar6 = pCVar6 + 1;
    } while (pCVar6 != pCVar2);
    uVar5 = uVar4 - uVar7;
  }
  return uVar5;
}

Assistant:

uint64_t ParquetReader::GetGroupSpan(ParquetReaderScanState &state) {
	auto &group = GetGroup(state);
	idx_t min_offset = NumericLimits<idx_t>::Maximum();
	idx_t max_offset = NumericLimits<idx_t>::Minimum();

	for (auto &column_chunk : group.columns) {

		// Set the min offset
		idx_t current_min_offset = NumericLimits<idx_t>::Maximum();
		if (column_chunk.meta_data.__isset.dictionary_page_offset) {
			current_min_offset = MinValue<idx_t>(current_min_offset, column_chunk.meta_data.dictionary_page_offset);
		}
		if (column_chunk.meta_data.__isset.index_page_offset) {
			current_min_offset = MinValue<idx_t>(current_min_offset, column_chunk.meta_data.index_page_offset);
		}
		current_min_offset = MinValue<idx_t>(current_min_offset, column_chunk.meta_data.data_page_offset);
		min_offset = MinValue<idx_t>(current_min_offset, min_offset);
		max_offset = MaxValue<idx_t>(max_offset, column_chunk.meta_data.total_compressed_size + current_min_offset);
	}

	return max_offset - min_offset;
}